

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  BVH *bvh;
  NodeRef root;
  size_t k;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  int iVar16;
  undefined4 uVar17;
  ulong uVar18;
  ulong uVar19;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  NodeRef *pNVar25;
  bool bVar26;
  vint4 ai_2;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar39;
  undefined1 in_ZMM0 [64];
  vint4 bi;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar56;
  float fVar58;
  vint4 bi_1;
  undefined1 auVar52 [16];
  float fVar60;
  undefined1 auVar53 [16];
  float fVar57;
  float fVar59;
  float fVar61;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 bi_3;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 bi_2;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  uint uVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  vint4 ai;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar81;
  undefined1 auVar76 [16];
  float fVar82;
  float fVar83;
  float fVar88;
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  vint4 ai_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar96 [16];
  vint4 ai_3;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar118;
  undefined1 auVar114 [16];
  float fVar116;
  float fVar117;
  undefined1 auVar115 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar119 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_3718 [8];
  float fStack_3710;
  float fStack_370c;
  undefined1 local_3708 [8];
  float fStack_3700;
  float fStack_36fc;
  undefined1 local_36f8 [8];
  float fStack_36f0;
  float fStack_36ec;
  undefined1 local_36e8 [8];
  float fStack_36e0;
  float fStack_36dc;
  float local_36a8;
  float fStack_36a4;
  float fStack_36a0;
  float fStack_369c;
  float local_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float local_3688;
  float fStack_3684;
  float fStack_3680;
  float fStack_367c;
  float local_3678;
  float fStack_3674;
  float fStack_3670;
  float fStack_366c;
  float local_3668;
  float fStack_3664;
  float fStack_3660;
  float fStack_365c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar55 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar34 = vpcmpeqd_avx(auVar55,(undefined1  [16])valid_i->field_0);
    auVar33 = ZEXT816(0) << 0x40;
    auVar2 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar33,5);
    auVar69 = auVar34 & auVar2;
    if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar69[0xf] < '\0')
    {
      auVar2 = vandps_avx(auVar2,auVar34);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar100._8_4_ = 0x7fffffff;
      auVar100._0_8_ = 0x7fffffff7fffffff;
      auVar100._12_4_ = 0x7fffffff;
      auVar34 = vandps_avx(auVar100,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar91._8_4_ = 0x219392ef;
      auVar91._0_8_ = 0x219392ef219392ef;
      auVar91._12_4_ = 0x219392ef;
      auVar34 = vcmpps_avx(auVar34,auVar91,1);
      auVar69 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar91,auVar34);
      auVar34 = vandps_avx(auVar100,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar34 = vcmpps_avx(auVar34,auVar91,1);
      auVar72 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar91,auVar34);
      auVar34 = vandps_avx(auVar100,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar34 = vcmpps_avx(auVar34,auVar91,1);
      auVar34 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar91,auVar34);
      auVar68 = vrcpps_avx(auVar69);
      fVar3 = auVar68._0_4_;
      auVar62._0_4_ = auVar69._0_4_ * fVar3;
      fVar4 = auVar68._4_4_;
      auVar62._4_4_ = auVar69._4_4_ * fVar4;
      fVar5 = auVar68._8_4_;
      auVar62._8_4_ = auVar69._8_4_ * fVar5;
      fVar6 = auVar68._12_4_;
      auVar62._12_4_ = auVar69._12_4_ * fVar6;
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = &DAT_3f8000003f800000;
      auVar92._12_4_ = 0x3f800000;
      auVar69 = vsubps_avx(auVar92,auVar62);
      tray.rdir.field_0._0_4_ = fVar3 + fVar3 * auVar69._0_4_;
      tray.rdir.field_0._4_4_ = fVar4 + fVar4 * auVar69._4_4_;
      tray.rdir.field_0._8_4_ = fVar5 + fVar5 * auVar69._8_4_;
      tray.rdir.field_0._12_4_ = fVar6 + fVar6 * auVar69._12_4_;
      auVar69 = vrcpps_avx(auVar72);
      fVar3 = auVar69._0_4_;
      auVar68._0_4_ = auVar72._0_4_ * fVar3;
      fVar4 = auVar69._4_4_;
      auVar68._4_4_ = auVar72._4_4_ * fVar4;
      fVar5 = auVar69._8_4_;
      auVar68._8_4_ = auVar72._8_4_ * fVar5;
      fVar6 = auVar69._12_4_;
      auVar68._12_4_ = auVar72._12_4_ * fVar6;
      auVar69 = vsubps_avx(auVar92,auVar68);
      tray.rdir.field_0._16_4_ = fVar3 + fVar3 * auVar69._0_4_;
      tray.rdir.field_0._20_4_ = fVar4 + fVar4 * auVar69._4_4_;
      tray.rdir.field_0._24_4_ = fVar5 + fVar5 * auVar69._8_4_;
      tray.rdir.field_0._28_4_ = fVar6 + fVar6 * auVar69._12_4_;
      auVar69 = vrcpps_avx(auVar34);
      fVar3 = auVar69._0_4_;
      auVar72._0_4_ = auVar34._0_4_ * fVar3;
      fVar4 = auVar69._4_4_;
      auVar72._4_4_ = auVar34._4_4_ * fVar4;
      fVar5 = auVar69._8_4_;
      auVar72._8_4_ = auVar34._8_4_ * fVar5;
      fVar6 = auVar69._12_4_;
      auVar72._12_4_ = auVar34._12_4_ * fVar6;
      auVar34 = vsubps_avx(auVar92,auVar72);
      tray.rdir.field_0._32_4_ = fVar3 + fVar3 * auVar34._0_4_;
      tray.rdir.field_0._36_4_ = fVar4 + fVar4 * auVar34._4_4_;
      tray.rdir.field_0._40_4_ = fVar5 + fVar5 * auVar34._8_4_;
      tray.rdir.field_0._44_4_ = fVar6 + fVar6 * auVar34._12_4_;
      auVar34 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar33,1);
      auVar84._8_4_ = 0x20;
      auVar84._0_8_ = 0x2000000020;
      auVar84._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar34,auVar84);
      auVar34 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar33,5);
      auVar69._8_4_ = 0x40;
      auVar69._0_8_ = 0x4000000040;
      auVar69._12_4_ = 0x40;
      auVar85._8_4_ = 0x60;
      auVar85._0_8_ = 0x6000000060;
      auVar85._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar85,auVar69,auVar34);
      auVar34 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar33,5);
      auVar73._8_4_ = 0x80;
      auVar73._0_8_ = 0x8000000080;
      auVar73._12_4_ = 0x80;
      auVar86._8_4_ = 0xa0;
      auVar86._0_8_ = 0xa0000000a0;
      auVar86._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar86,auVar73,auVar34);
      auVar34 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar33);
      auVar69 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar33);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar115 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar34,auVar2);
      auVar34._8_4_ = 0xff800000;
      auVar34._0_8_ = 0xff800000ff800000;
      auVar34._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar34,auVar69,auVar2);
      terminated.field_0._0_4_ = auVar2._0_4_ ^ auVar55._0_4_;
      terminated.field_0._4_4_ = auVar2._4_4_ ^ auVar55._4_4_;
      terminated.field_0._8_4_ = auVar2._8_4_ ^ auVar55._8_4_;
      terminated.field_0._12_4_ = auVar2._12_4_ ^ auVar55._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar24 = 3;
      }
      else {
        uVar24 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar25 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar20 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar55 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      auVar119 = ZEXT1664(auVar55);
LAB_0041a146:
      paVar20 = &((vfloat<4> *)paVar20)[-1].field_0;
      root.ptr = pNVar25[-1].ptr;
      pNVar25 = pNVar25 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0041aae4;
      aVar120 = *paVar20;
      auVar55 = vcmpps_avx((undefined1  [16])aVar120,(undefined1  [16])tray.tfar.field_0,1);
      uVar15 = vmovmskps_avx(auVar55);
      if (uVar15 == 0) {
LAB_0041aaf5:
        iVar16 = 2;
      }
      else {
        uVar23 = (ulong)(uVar15 & 0xff);
        uVar15 = POPCOUNT(uVar15 & 0xff);
        iVar16 = 0;
        if (uVar15 <= uVar24) {
          do {
            k = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> k & 1) == 0; k = k + 1) {
              }
            }
            bVar26 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar26) {
              terminated.field_0.i[k] = -1;
            }
            uVar23 = uVar23 & uVar23 - 1;
          } while (uVar23 != 0);
          auVar55 = vpcmpeqd_avx(auVar119._0_16_,auVar119._0_16_);
          auVar119 = ZEXT1664(auVar55);
          auVar55 = auVar55 & ~(undefined1  [16])terminated.field_0;
          iVar16 = 3;
          auVar115 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar55[0xf] < '\0') {
            auVar55._8_4_ = 0xff800000;
            auVar55._0_8_ = 0xff800000ff800000;
            auVar55._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar55,
                               (undefined1  [16])terminated.field_0);
            iVar16 = 2;
          }
        }
        if (uVar24 < uVar15) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0041aae4;
              auVar55 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar120,6);
              if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar55[0xf]) goto LAB_0041aaf5;
              uVar23 = (ulong)((uint)root.ptr & 0xf);
              aVar39 = terminated.field_0;
              if (uVar23 == 8) goto LAB_0041aaae;
              lVar21 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar18 = 0;
              auVar55 = auVar119._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_0041a429;
            }
            auVar124 = ZEXT1664(auVar115._0_16_);
            uVar23 = 0;
            uVar18 = 8;
            do {
              uVar19 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar23 * 8);
              if (uVar19 != 8) {
                uVar17 = *(undefined4 *)(root.ptr + 0x40 + uVar23 * 4);
                auVar27._4_4_ = uVar17;
                auVar27._0_4_ = uVar17;
                auVar27._8_4_ = uVar17;
                auVar27._12_4_ = uVar17;
                auVar10._8_8_ = tray.org.field_0._8_8_;
                auVar10._0_8_ = tray.org.field_0._0_8_;
                auVar11._8_8_ = tray.org.field_0._24_8_;
                auVar11._0_8_ = tray.org.field_0._16_8_;
                auVar12._8_8_ = tray.org.field_0._40_8_;
                auVar12._0_8_ = tray.org.field_0._32_8_;
                auVar55 = vsubps_avx(auVar27,auVar10);
                auVar74._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar55._0_4_;
                auVar74._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar55._4_4_;
                auVar74._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar55._8_4_;
                auVar74._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar55._12_4_;
                uVar17 = *(undefined4 *)(root.ptr + 0x80 + uVar23 * 4);
                auVar28._4_4_ = uVar17;
                auVar28._0_4_ = uVar17;
                auVar28._8_4_ = uVar17;
                auVar28._12_4_ = uVar17;
                auVar55 = vsubps_avx(auVar28,auVar11);
                auVar93._0_4_ = tray.rdir.field_0._16_4_ * auVar55._0_4_;
                auVar93._4_4_ = tray.rdir.field_0._20_4_ * auVar55._4_4_;
                auVar93._8_4_ = tray.rdir.field_0._24_4_ * auVar55._8_4_;
                auVar93._12_4_ = tray.rdir.field_0._28_4_ * auVar55._12_4_;
                uVar17 = *(undefined4 *)(root.ptr + 0xc0 + uVar23 * 4);
                auVar29._4_4_ = uVar17;
                auVar29._0_4_ = uVar17;
                auVar29._8_4_ = uVar17;
                auVar29._12_4_ = uVar17;
                auVar55 = vsubps_avx(auVar29,auVar12);
                auVar101._0_4_ = tray.rdir.field_0._32_4_ * auVar55._0_4_;
                auVar101._4_4_ = tray.rdir.field_0._36_4_ * auVar55._4_4_;
                auVar101._8_4_ = tray.rdir.field_0._40_4_ * auVar55._8_4_;
                auVar101._12_4_ = tray.rdir.field_0._44_4_ * auVar55._12_4_;
                uVar17 = *(undefined4 *)(root.ptr + 0x60 + uVar23 * 4);
                auVar30._4_4_ = uVar17;
                auVar30._0_4_ = uVar17;
                auVar30._8_4_ = uVar17;
                auVar30._12_4_ = uVar17;
                auVar55 = vsubps_avx(auVar30,auVar10);
                auVar40._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar55._0_4_;
                auVar40._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar55._4_4_;
                auVar40._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar55._8_4_;
                auVar40._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar55._12_4_;
                uVar17 = *(undefined4 *)(root.ptr + 0xa0 + uVar23 * 4);
                auVar31._4_4_ = uVar17;
                auVar31._0_4_ = uVar17;
                auVar31._8_4_ = uVar17;
                auVar31._12_4_ = uVar17;
                auVar55 = vsubps_avx(auVar31,auVar11);
                auVar52._0_4_ = tray.rdir.field_0._16_4_ * auVar55._0_4_;
                auVar52._4_4_ = tray.rdir.field_0._20_4_ * auVar55._4_4_;
                auVar52._8_4_ = tray.rdir.field_0._24_4_ * auVar55._8_4_;
                auVar52._12_4_ = tray.rdir.field_0._28_4_ * auVar55._12_4_;
                uVar17 = *(undefined4 *)(root.ptr + 0xe0 + uVar23 * 4);
                auVar32._4_4_ = uVar17;
                auVar32._0_4_ = uVar17;
                auVar32._8_4_ = uVar17;
                auVar32._12_4_ = uVar17;
                auVar55 = vsubps_avx(auVar32,auVar12);
                auVar63._0_4_ = tray.rdir.field_0._32_4_ * auVar55._0_4_;
                auVar63._4_4_ = tray.rdir.field_0._36_4_ * auVar55._4_4_;
                auVar63._8_4_ = tray.rdir.field_0._40_4_ * auVar55._8_4_;
                auVar63._12_4_ = tray.rdir.field_0._44_4_ * auVar55._12_4_;
                auVar55 = vpminsd_avx(auVar74,auVar40);
                auVar34 = vpminsd_avx(auVar93,auVar52);
                auVar55 = vpmaxsd_avx(auVar55,auVar34);
                auVar34 = vpminsd_avx(auVar101,auVar63);
                auVar34 = vpmaxsd_avx(auVar55,auVar34);
                auVar55 = vpmaxsd_avx(auVar74,auVar40);
                auVar69 = vpmaxsd_avx(auVar93,auVar52);
                auVar69 = vpminsd_avx(auVar55,auVar69);
                auVar55 = vpmaxsd_avx(auVar101,auVar63);
                auVar69 = vpminsd_avx(auVar69,auVar55);
                auVar55 = vpmaxsd_avx(auVar34,(undefined1  [16])tray.tnear.field_0);
                auVar69 = vpminsd_avx(auVar69,(undefined1  [16])tray.tfar.field_0);
                auVar55 = vcmpps_avx(auVar55,auVar69,2);
                if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar55[0xf] < '\0') {
                  auVar55 = vblendvps_avx(auVar115._0_16_,auVar34,auVar55);
                  if (uVar18 != 8) {
                    pNVar25->ptr = uVar18;
                    pNVar25 = pNVar25 + 1;
                    *paVar20 = auVar124._0_16_;
                    paVar20 = paVar20 + 1;
                  }
                  auVar124 = ZEXT1664(auVar55);
                  uVar18 = uVar19;
                }
              }
              aVar120 = auVar124._0_16_;
            } while ((uVar19 != 8) && (bVar26 = uVar23 < 7, uVar23 = uVar23 + 1, bVar26));
            iVar16 = 0;
            if (uVar18 == 8) {
LAB_0041a333:
              bVar26 = false;
              iVar16 = 4;
            }
            else {
              auVar55 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar120,6);
              uVar17 = vmovmskps_avx(auVar55);
              bVar26 = true;
              if ((uint)POPCOUNT(uVar17) <= uVar24) {
                pNVar25->ptr = uVar18;
                pNVar25 = pNVar25 + 1;
                *paVar20 = aVar120;
                paVar20 = paVar20 + 1;
                goto LAB_0041a333;
              }
            }
            root.ptr = uVar18;
          } while (bVar26);
        }
      }
      goto LAB_0041aae7;
    }
  }
  return;
  while( true ) {
    uVar18 = uVar18 + 1;
    lVar21 = lVar21 + 0xe0;
    auVar55 = auVar69;
    if (uVar23 - 8 <= uVar18) break;
LAB_0041a429:
    auVar124 = ZEXT1664(auVar55);
    uVar19 = 0;
    while( true ) {
      auVar34 = auVar124._0_16_;
      uVar22 = (ulong)*(uint *)(lVar21 + uVar19 * 4);
      if (uVar22 == 0xffffffff) break;
      fVar3 = *(float *)(lVar21 + -0xc0 + uVar19 * 4);
      auVar70._4_4_ = fVar3;
      auVar70._0_4_ = fVar3;
      auVar70._8_4_ = fVar3;
      auVar70._12_4_ = fVar3;
      fVar4 = *(float *)(lVar21 + -0xb0 + uVar19 * 4);
      auVar33._4_4_ = fVar4;
      auVar33._0_4_ = fVar4;
      auVar33._8_4_ = fVar4;
      auVar33._12_4_ = fVar4;
      fVar5 = *(float *)(lVar21 + -0xa0 + uVar19 * 4);
      auVar64._4_4_ = fVar5;
      auVar64._0_4_ = fVar5;
      auVar64._8_4_ = fVar5;
      auVar64._12_4_ = fVar5;
      local_36e8._4_4_ = *(float *)(lVar21 + -0x90 + uVar19 * 4);
      local_36f8._4_4_ = *(float *)(lVar21 + -0x80 + uVar19 * 4);
      local_3708._4_4_ = *(float *)(lVar21 + -0x70 + uVar19 * 4);
      local_3718._4_4_ = *(float *)(lVar21 + -0x30 + uVar19 * 4);
      fVar6 = *(float *)(lVar21 + -0x20 + uVar19 * 4);
      fVar1 = *(float *)(lVar21 + -0x10 + uVar19 * 4);
      local_36e8._0_4_ = local_36e8._4_4_;
      fStack_36e0 = (float)local_36e8._4_4_;
      fStack_36dc = (float)local_36e8._4_4_;
      fVar7 = fVar3 - (float)local_36e8._4_4_;
      local_36f8._0_4_ = local_36f8._4_4_;
      fStack_36f0 = (float)local_36f8._4_4_;
      fStack_36ec = (float)local_36f8._4_4_;
      fVar8 = fVar4 - (float)local_36f8._4_4_;
      local_3708._0_4_ = local_3708._4_4_;
      fStack_3700 = (float)local_3708._4_4_;
      fStack_36fc = (float)local_3708._4_4_;
      fVar9 = fVar5 - (float)local_3708._4_4_;
      fVar4 = fVar6 - fVar4;
      fVar5 = fVar1 - fVar5;
      local_3718._0_4_ = local_3718._4_4_;
      fStack_3710 = (float)local_3718._4_4_;
      fStack_370c = (float)local_3718._4_4_;
      fVar3 = (float)local_3718._4_4_ - fVar3;
      auVar69 = vsubps_avx(auVar33,*(undefined1 (*) [16])(ray + 0x10));
      auVar33 = vsubps_avx(auVar64,*(undefined1 (*) [16])(ray + 0x20));
      local_3668 = (float)*(undefined8 *)(ray + 0x50);
      fStack_3664 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_3660 = (float)*(undefined8 *)(ray + 0x58);
      fStack_365c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      fVar71 = auVar33._0_4_;
      auVar102._0_4_ = fVar71 * local_3668;
      fVar78 = auVar33._4_4_;
      auVar102._4_4_ = fVar78 * fStack_3664;
      fVar80 = auVar33._8_4_;
      auVar102._8_4_ = fVar80 * fStack_3660;
      fVar82 = auVar33._12_4_;
      auVar102._12_4_ = fVar82 * fStack_365c;
      local_3678 = (float)*(undefined8 *)(ray + 0x60);
      fStack_3674 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_3670 = (float)*(undefined8 *)(ray + 0x68);
      fStack_366c = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar50 = auVar69._0_4_;
      auVar111._0_4_ = fVar50 * local_3678;
      fVar56 = auVar69._4_4_;
      auVar111._4_4_ = fVar56 * fStack_3674;
      fVar58 = auVar69._8_4_;
      auVar111._8_4_ = fVar58 * fStack_3670;
      fVar60 = auVar69._12_4_;
      auVar111._12_4_ = fVar60 * fStack_366c;
      auVar84 = vsubps_avx(auVar111,auVar102);
      auVar69 = vsubps_avx(auVar70,*(undefined1 (*) [16])ray);
      fVar51 = auVar69._0_4_;
      auVar103._0_4_ = fVar51 * local_3678;
      fVar57 = auVar69._4_4_;
      auVar103._4_4_ = fVar57 * fStack_3674;
      fVar59 = auVar69._8_4_;
      auVar103._8_4_ = fVar59 * fStack_3670;
      fVar61 = auVar69._12_4_;
      auVar103._12_4_ = fVar61 * fStack_366c;
      local_3688 = (float)*(undefined8 *)(ray + 0x40);
      fStack_3684 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      fStack_3680 = (float)*(undefined8 *)(ray + 0x48);
      fStack_367c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      auVar112._0_4_ = fVar71 * local_3688;
      auVar112._4_4_ = fVar78 * fStack_3684;
      auVar112._8_4_ = fVar80 * fStack_3680;
      auVar112._12_4_ = fVar82 * fStack_367c;
      auVar85 = vsubps_avx(auVar112,auVar103);
      auVar113._0_4_ = fVar50 * local_3688;
      auVar113._4_4_ = fVar56 * fStack_3684;
      auVar113._8_4_ = fVar58 * fStack_3680;
      auVar113._12_4_ = fVar60 * fStack_367c;
      auVar121._0_4_ = local_3668 * fVar51;
      auVar121._4_4_ = fStack_3664 * fVar57;
      auVar121._8_4_ = fStack_3660 * fVar59;
      auVar121._12_4_ = fStack_365c * fVar61;
      auVar86 = vsubps_avx(auVar121,auVar113);
      auVar69 = ZEXT416((uint)(fVar7 * fVar5 - fVar3 * fVar9));
      auVar33 = vshufps_avx(auVar69,auVar69,0);
      auVar69 = ZEXT416((uint)(fVar8 * fVar3 - fVar4 * fVar7));
      auVar72 = vshufps_avx(auVar69,auVar69,0);
      auVar124 = ZEXT1664(auVar34);
      auVar91 = vpermilps_avx(ZEXT416((uint)(fVar4 * fVar9 - fVar8 * fVar5)),0);
      auVar122._0_4_ =
           auVar91._0_4_ * local_3688 + auVar72._0_4_ * local_3678 + local_3668 * auVar33._0_4_;
      auVar122._4_4_ =
           auVar91._4_4_ * fStack_3684 + auVar72._4_4_ * fStack_3674 + fStack_3664 * auVar33._4_4_;
      auVar122._8_4_ =
           auVar91._8_4_ * fStack_3680 + auVar72._8_4_ * fStack_3670 + fStack_3660 * auVar33._8_4_;
      auVar122._12_4_ =
           auVar91._12_4_ * fStack_367c +
           auVar72._12_4_ * fStack_366c + fStack_365c * auVar33._12_4_;
      auVar68 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
      auVar62 = vshufps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),0);
      auVar73 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar75._8_4_ = 0x80000000;
      auVar75._0_8_ = 0x8000000080000000;
      auVar75._12_4_ = 0x80000000;
      auVar69 = vandps_avx(auVar122,auVar75);
      uVar15 = auVar69._0_4_;
      auVar126._0_4_ =
           uVar15 ^ (uint)(auVar73._0_4_ * auVar84._0_4_ +
                          auVar85._0_4_ * auVar68._0_4_ + auVar86._0_4_ * auVar62._0_4_);
      uVar77 = auVar69._4_4_;
      auVar126._4_4_ =
           uVar77 ^ (uint)(auVar73._4_4_ * auVar84._4_4_ +
                          auVar85._4_4_ * auVar68._4_4_ + auVar86._4_4_ * auVar62._4_4_);
      uVar79 = auVar69._8_4_;
      auVar126._8_4_ =
           uVar79 ^ (uint)(auVar73._8_4_ * auVar84._8_4_ +
                          auVar85._8_4_ * auVar68._8_4_ + auVar86._8_4_ * auVar62._8_4_);
      uVar81 = auVar69._12_4_;
      auVar126._12_4_ =
           uVar81 ^ (uint)(auVar73._12_4_ * auVar84._12_4_ +
                          auVar85._12_4_ * auVar68._12_4_ + auVar86._12_4_ * auVar62._12_4_);
      auVar69 = vcmpps_avx(auVar126,_DAT_01feba10,5);
      auVar68 = auVar34 & auVar69;
      local_3698 = (float)*(undefined8 *)(ray + 0x30);
      fStack_3694 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_3690 = (float)*(undefined8 *)(ray + 0x38);
      fStack_368c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_36a8 = (float)*(undefined8 *)(ray + 0x80);
      fStack_36a4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_36a0 = (float)*(undefined8 *)(ray + 0x88);
      fStack_369c = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar68[0xf] < '\0'
         ) {
        auVar68 = vpermilps_avx(ZEXT416((uint)fVar7),0);
        auVar62 = vpermilps_avx(ZEXT416((uint)fVar8),0);
        auVar73 = vpermilps_avx(ZEXT416((uint)fVar9),0);
        auVar69 = vandps_avx(auVar69,auVar34);
        auVar109._0_4_ =
             uVar15 ^ (uint)(auVar68._0_4_ * auVar84._0_4_ +
                            auVar73._0_4_ * auVar86._0_4_ + auVar85._0_4_ * auVar62._0_4_);
        auVar109._4_4_ =
             uVar77 ^ (uint)(auVar68._4_4_ * auVar84._4_4_ +
                            auVar73._4_4_ * auVar86._4_4_ + auVar85._4_4_ * auVar62._4_4_);
        auVar109._8_4_ =
             uVar79 ^ (uint)(auVar68._8_4_ * auVar84._8_4_ +
                            auVar73._8_4_ * auVar86._8_4_ + auVar85._8_4_ * auVar62._8_4_);
        auVar109._12_4_ =
             uVar81 ^ (uint)(auVar68._12_4_ * auVar84._12_4_ +
                            auVar73._12_4_ * auVar86._12_4_ + auVar85._12_4_ * auVar62._12_4_);
        auVar68 = vcmpps_avx(auVar109,_DAT_01feba10,5);
        auVar62 = auVar69 & auVar68;
        if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar62[0xf] < '\0') {
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar62 = vandps_avx(auVar122,auVar43);
          auVar69 = vandps_avx(auVar68,auVar69);
          auVar68 = vsubps_avx(auVar62,auVar126);
          auVar68 = vcmpps_avx(auVar68,auVar109,5);
          auVar73 = auVar69 & auVar68;
          if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar73[0xf] < '\0') {
            auVar69 = vandps_avx(auVar68,auVar69);
            auVar37._0_4_ =
                 uVar15 ^ (uint)(auVar91._0_4_ * fVar51 +
                                fVar71 * auVar72._0_4_ + fVar50 * auVar33._0_4_);
            auVar37._4_4_ =
                 uVar77 ^ (uint)(auVar91._4_4_ * fVar57 +
                                fVar78 * auVar72._4_4_ + fVar56 * auVar33._4_4_);
            auVar37._8_4_ =
                 uVar79 ^ (uint)(auVar91._8_4_ * fVar59 +
                                fVar80 * auVar72._8_4_ + fVar58 * auVar33._8_4_);
            auVar37._12_4_ =
                 uVar81 ^ (uint)(auVar91._12_4_ * fVar61 +
                                fVar82 * auVar72._12_4_ + fVar60 * auVar33._12_4_);
            auVar67._0_4_ = auVar62._0_4_ * local_3698;
            auVar67._4_4_ = auVar62._4_4_ * fStack_3694;
            auVar67._8_4_ = auVar62._8_4_ * fStack_3690;
            auVar67._12_4_ = auVar62._12_4_ * fStack_368c;
            auVar33 = vcmpps_avx(auVar67,auVar37,1);
            auVar44._0_4_ = auVar62._0_4_ * local_36a8;
            auVar44._4_4_ = auVar62._4_4_ * fStack_36a4;
            auVar44._8_4_ = auVar62._8_4_ * fStack_36a0;
            auVar44._12_4_ = auVar62._12_4_ * fStack_369c;
            auVar72 = vcmpps_avx(auVar37,auVar44,2);
            auVar33 = vandps_avx(auVar72,auVar33);
            auVar72 = auVar69 & auVar33;
            if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar72[0xf] < '\0') {
              auVar69 = vandps_avx(auVar33,auVar69);
              auVar33 = vcmpps_avx(auVar122,_DAT_01feba10,4);
              auVar72 = auVar69 & auVar33;
              if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar72[0xf] < '\0') {
                auVar69 = vandps_avx(auVar33,auVar69);
                uVar15 = ((context->scene->geometries).items[uVar22].ptr)->mask;
                auVar45._4_4_ = uVar15;
                auVar45._0_4_ = uVar15;
                auVar45._8_4_ = uVar15;
                auVar45._12_4_ = uVar15;
                auVar33 = vandps_avx(auVar45,*(undefined1 (*) [16])(ray + 0x90));
                auVar33 = vpcmpeqd_avx(auVar33,_DAT_01feba10);
                auVar72 = auVar69 & ~auVar33;
                if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar72[0xf] < '\0') {
                  auVar69 = vandnps_avx(auVar33,auVar69);
                  auVar34 = vandnps_avx(auVar69,auVar34);
                  auVar124 = ZEXT1664(auVar34);
                  goto LAB_0041a5f5;
                }
              }
            }
          }
          auVar124 = ZEXT1664(auVar34);
        }
      }
LAB_0041a5f5:
      auVar34 = auVar124._0_16_;
      if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar124[0xf])
      {
        bVar26 = false;
        auVar69 = vpcmpeqd_avx(auVar91,auVar91);
      }
      else {
        uVar17 = *(undefined4 *)(lVar21 + -0x60 + uVar19 * 4);
        auVar53._4_4_ = uVar17;
        auVar53._0_4_ = uVar17;
        auVar53._8_4_ = uVar17;
        auVar53._12_4_ = uVar17;
        uVar17 = *(undefined4 *)(lVar21 + -0x50 + uVar19 * 4);
        auVar76._4_4_ = uVar17;
        auVar76._0_4_ = uVar17;
        auVar76._8_4_ = uVar17;
        auVar76._12_4_ = uVar17;
        uVar17 = *(undefined4 *)(lVar21 + -0x40 + uVar19 * 4);
        auVar87._4_4_ = uVar17;
        auVar87._0_4_ = uVar17;
        auVar87._8_4_ = uVar17;
        auVar87._12_4_ = uVar17;
        auVar69 = vsubps_avx(auVar53,_local_3718);
        auVar14._4_4_ = fVar6;
        auVar14._0_4_ = fVar6;
        auVar14._8_4_ = fVar6;
        auVar14._12_4_ = fVar6;
        auVar33 = vsubps_avx(auVar76,auVar14);
        auVar13._4_4_ = fVar1;
        auVar13._0_4_ = fVar1;
        auVar13._8_4_ = fVar1;
        auVar13._12_4_ = fVar1;
        auVar72 = vsubps_avx(auVar87,auVar13);
        auVar68 = vsubps_avx(_local_36e8,auVar53);
        auVar62 = vsubps_avx(_local_36f8,auVar76);
        auVar73 = vsubps_avx(_local_3708,auVar87);
        fVar3 = auVar33._0_4_;
        fVar128 = auVar73._0_4_;
        auVar35._0_4_ = fVar128 * fVar3;
        fVar6 = auVar33._4_4_;
        fVar129 = auVar73._4_4_;
        auVar35._4_4_ = fVar129 * fVar6;
        fVar8 = auVar33._8_4_;
        fVar130 = auVar73._8_4_;
        auVar35._8_4_ = fVar130 * fVar8;
        fVar56 = auVar33._12_4_;
        fVar131 = auVar73._12_4_;
        auVar35._12_4_ = fVar131 * fVar56;
        fVar4 = auVar72._0_4_;
        fVar110 = auVar62._0_4_;
        auVar41._0_4_ = fVar110 * fVar4;
        fVar1 = auVar72._4_4_;
        fVar116 = auVar62._4_4_;
        auVar41._4_4_ = fVar116 * fVar1;
        fVar9 = auVar72._8_4_;
        fVar117 = auVar62._8_4_;
        auVar41._8_4_ = fVar117 * fVar9;
        fVar58 = auVar72._12_4_;
        fVar118 = auVar62._12_4_;
        auVar41._12_4_ = fVar118 * fVar58;
        auVar33 = vsubps_avx(auVar41,auVar35);
        fVar95 = auVar68._0_4_;
        auVar42._0_4_ = fVar95 * fVar4;
        fVar97 = auVar68._4_4_;
        auVar42._4_4_ = fVar97 * fVar1;
        fVar98 = auVar68._8_4_;
        auVar42._8_4_ = fVar98 * fVar9;
        fVar99 = auVar68._12_4_;
        auVar42._12_4_ = fVar99 * fVar58;
        fVar5 = auVar69._0_4_;
        auVar65._0_4_ = fVar128 * fVar5;
        fVar7 = auVar69._4_4_;
        auVar65._4_4_ = fVar129 * fVar7;
        fVar50 = auVar69._8_4_;
        auVar65._8_4_ = fVar130 * fVar50;
        fVar60 = auVar69._12_4_;
        auVar65._12_4_ = fVar131 * fVar60;
        auVar72 = vsubps_avx(auVar65,auVar42);
        auVar66._0_4_ = fVar110 * fVar5;
        auVar66._4_4_ = fVar116 * fVar7;
        auVar66._8_4_ = fVar117 * fVar50;
        auVar66._12_4_ = fVar118 * fVar60;
        auVar104._0_4_ = fVar95 * fVar3;
        auVar104._4_4_ = fVar97 * fVar6;
        auVar104._8_4_ = fVar98 * fVar8;
        auVar104._12_4_ = fVar99 * fVar56;
        auVar68 = vsubps_avx(auVar104,auVar66);
        auVar69 = vsubps_avx(auVar53,*(undefined1 (*) [16])ray);
        auVar62 = vsubps_avx(auVar76,*(undefined1 (*) [16])(ray + 0x10));
        auVar73 = vsubps_avx(auVar87,*(undefined1 (*) [16])(ray + 0x20));
        fVar83 = auVar73._0_4_;
        auVar105._0_4_ = fVar83 * local_3668;
        fVar88 = auVar73._4_4_;
        auVar105._4_4_ = fVar88 * fStack_3664;
        fVar89 = auVar73._8_4_;
        auVar105._8_4_ = fVar89 * fStack_3660;
        fVar90 = auVar73._12_4_;
        auVar105._12_4_ = fVar90 * fStack_365c;
        fVar71 = auVar62._0_4_;
        auVar123._0_4_ = fVar71 * local_3678;
        fVar78 = auVar62._4_4_;
        auVar123._4_4_ = fVar78 * fStack_3674;
        fVar80 = auVar62._8_4_;
        auVar123._8_4_ = fVar80 * fStack_3670;
        fVar82 = auVar62._12_4_;
        auVar123._12_4_ = fVar82 * fStack_366c;
        auVar62 = vsubps_avx(auVar123,auVar105);
        fVar51 = auVar69._0_4_;
        auVar106._0_4_ = fVar51 * local_3678;
        fVar57 = auVar69._4_4_;
        auVar106._4_4_ = fVar57 * fStack_3674;
        fVar59 = auVar69._8_4_;
        auVar106._8_4_ = fVar59 * fStack_3670;
        fVar61 = auVar69._12_4_;
        auVar106._12_4_ = fVar61 * fStack_366c;
        auVar125._0_4_ = fVar83 * local_3688;
        auVar125._4_4_ = fVar88 * fStack_3684;
        auVar125._8_4_ = fVar89 * fStack_3680;
        auVar125._12_4_ = fVar90 * fStack_367c;
        auVar73 = vsubps_avx(auVar125,auVar106);
        auVar107._0_4_ = fVar71 * local_3688;
        auVar107._4_4_ = fVar78 * fStack_3684;
        auVar107._8_4_ = fVar80 * fStack_3680;
        auVar107._12_4_ = fVar82 * fStack_367c;
        auVar127._0_4_ = fVar51 * local_3668;
        auVar127._4_4_ = fVar57 * fStack_3664;
        auVar127._8_4_ = fVar59 * fStack_3660;
        auVar127._12_4_ = fVar61 * fStack_365c;
        auVar84 = vsubps_avx(auVar127,auVar107);
        auVar108._0_4_ =
             auVar33._0_4_ * local_3688 + auVar68._0_4_ * local_3678 + local_3668 * auVar72._0_4_;
        auVar108._4_4_ =
             auVar33._4_4_ * fStack_3684 + auVar68._4_4_ * fStack_3674 + fStack_3664 * auVar72._4_4_
        ;
        auVar108._8_4_ =
             auVar33._8_4_ * fStack_3680 + auVar68._8_4_ * fStack_3670 + fStack_3660 * auVar72._8_4_
        ;
        auVar108._12_4_ =
             auVar33._12_4_ * fStack_367c +
             auVar68._12_4_ * fStack_366c + fStack_365c * auVar72._12_4_;
        auVar114._8_4_ = 0x80000000;
        auVar114._0_8_ = 0x8000000080000000;
        auVar114._12_4_ = 0x80000000;
        auVar69 = vandps_avx(auVar108,auVar114);
        uVar15 = auVar69._0_4_;
        auVar96._0_4_ =
             uVar15 ^ (uint)(fVar95 * auVar62._0_4_ +
                            fVar110 * auVar73._0_4_ + fVar128 * auVar84._0_4_);
        uVar77 = auVar69._4_4_;
        auVar96._4_4_ =
             uVar77 ^ (uint)(fVar97 * auVar62._4_4_ +
                            fVar116 * auVar73._4_4_ + fVar129 * auVar84._4_4_);
        uVar79 = auVar69._8_4_;
        auVar96._8_4_ =
             uVar79 ^ (uint)(fVar98 * auVar62._8_4_ +
                            fVar117 * auVar73._8_4_ + fVar130 * auVar84._8_4_);
        uVar81 = auVar69._12_4_;
        auVar96._12_4_ =
             uVar81 ^ (uint)(fVar99 * auVar62._12_4_ +
                            fVar118 * auVar73._12_4_ + fVar131 * auVar84._12_4_);
        auVar69 = vcmpps_avx(auVar96,_DAT_01feba10,5);
        auVar85 = auVar34 & auVar69;
        if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar85[0xf]
           ) {
          auVar69 = vpcmpeqd_avx(auVar33,auVar33);
        }
        else {
          auVar69 = vandps_avx(auVar69,auVar34);
          auVar94._0_4_ =
               uVar15 ^ (uint)(auVar62._0_4_ * fVar5 + auVar73._0_4_ * fVar3 + auVar84._0_4_ * fVar4
                              );
          auVar94._4_4_ =
               uVar77 ^ (uint)(auVar62._4_4_ * fVar7 + auVar73._4_4_ * fVar6 + auVar84._4_4_ * fVar1
                              );
          auVar94._8_4_ =
               uVar79 ^ (uint)(auVar62._8_4_ * fVar50 +
                              auVar73._8_4_ * fVar8 + auVar84._8_4_ * fVar9);
          auVar94._12_4_ =
               uVar81 ^ (uint)(auVar62._12_4_ * fVar60 +
                              auVar73._12_4_ * fVar56 + auVar84._12_4_ * fVar58);
          auVar62 = vcmpps_avx(auVar94,_DAT_01feba10,5);
          auVar73 = auVar69 & auVar62;
          if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar73[0xf]) {
            auVar69 = vpcmpeqd_avx(auVar62,auVar62);
          }
          else {
            auVar36._8_4_ = 0x7fffffff;
            auVar36._0_8_ = 0x7fffffff7fffffff;
            auVar36._12_4_ = 0x7fffffff;
            auVar73 = vandps_avx(auVar108,auVar36);
            auVar69 = vandps_avx(auVar62,auVar69);
            auVar62 = vsubps_avx(auVar73,auVar96);
            auVar62 = vcmpps_avx(auVar62,auVar94,5);
            auVar84 = auVar69 & auVar62;
            if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar84[0xf] < '\0') {
              auVar62 = vandps_avx(auVar69,auVar62);
              auVar38._0_4_ =
                   uVar15 ^ (uint)(auVar33._0_4_ * fVar51 +
                                  auVar68._0_4_ * fVar83 + fVar71 * auVar72._0_4_);
              auVar38._4_4_ =
                   uVar77 ^ (uint)(auVar33._4_4_ * fVar57 +
                                  auVar68._4_4_ * fVar88 + fVar78 * auVar72._4_4_);
              auVar38._8_4_ =
                   uVar79 ^ (uint)(auVar33._8_4_ * fVar59 +
                                  auVar68._8_4_ * fVar89 + fVar80 * auVar72._8_4_);
              auVar38._12_4_ =
                   uVar81 ^ (uint)(auVar33._12_4_ * fVar61 +
                                  auVar68._12_4_ * fVar90 + fVar82 * auVar72._12_4_);
              auVar46._0_4_ = auVar73._0_4_ * local_3698;
              auVar46._4_4_ = auVar73._4_4_ * fStack_3694;
              auVar46._8_4_ = auVar73._8_4_ * fStack_3690;
              auVar46._12_4_ = auVar73._12_4_ * fStack_368c;
              auVar33 = vcmpps_avx(auVar46,auVar38,1);
              auVar54._0_4_ = auVar73._0_4_ * local_36a8;
              auVar54._4_4_ = auVar73._4_4_ * fStack_36a4;
              auVar54._8_4_ = auVar73._8_4_ * fStack_36a0;
              auVar54._12_4_ = auVar73._12_4_ * fStack_369c;
              auVar72 = vcmpps_avx(auVar38,auVar54,2);
              auVar33 = vandps_avx(auVar72,auVar33);
              auVar72 = auVar62 & auVar33;
              if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar72[0xf] < '\0') {
                auVar33 = vandps_avx(auVar33,auVar62);
                auVar72 = vcmpps_avx(auVar108,_DAT_01feba10,4);
                auVar68 = auVar33 & auVar72;
                if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar68[0xf] < '\0') {
                  auVar33 = vandps_avx(auVar72,auVar33);
                  uVar15 = ((context->scene->geometries).items[uVar22].ptr)->mask;
                  auVar47._4_4_ = uVar15;
                  auVar47._0_4_ = uVar15;
                  auVar47._8_4_ = uVar15;
                  auVar47._12_4_ = uVar15;
                  auVar72 = vandps_avx(auVar47,*(undefined1 (*) [16])(ray + 0x90));
                  auVar72 = vpcmpeqd_avx(auVar72,_DAT_01feba10);
                  auVar68 = auVar33 & ~auVar72;
                  if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar68[0xf] < '\0') {
                    auVar33 = vandnps_avx(auVar72,auVar33);
                    auVar34 = vandnps_avx(auVar33,auVar34);
                    auVar69 = vpcmpeqd_avx(auVar69,auVar69);
                    goto LAB_0041a76c;
                  }
                }
              }
            }
            auVar69 = vpcmpeqd_avx(auVar69,auVar69);
          }
        }
LAB_0041a76c:
        auVar124 = ZEXT1664(auVar34);
        bVar26 = (((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 auVar34[0xf] < '\0';
      }
      auVar119 = ZEXT1664(auVar69);
      auVar115 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar34 = auVar124._0_16_;
      if ((!bVar26) || (bVar26 = 2 < uVar19, uVar19 = uVar19 + 1, bVar26)) break;
    }
    auVar69 = vandps_avx(auVar34,auVar55);
    auVar55 = auVar55 & auVar34;
    if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar55[0xf])
    break;
  }
  aVar39._0_4_ = auVar119._0_4_ ^ auVar69._0_4_;
  aVar39._4_4_ = auVar119._4_4_ ^ auVar69._4_4_;
  aVar39._8_4_ = auVar119._8_4_ ^ auVar69._8_4_;
  aVar39._12_4_ = auVar119._12_4_ ^ auVar69._12_4_;
LAB_0041aaae:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar39);
  auVar55 = auVar119._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar55 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar55 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar55[0xf]) {
LAB_0041aae4:
    iVar16 = 3;
  }
  else {
    auVar48._8_4_ = 0xff800000;
    auVar48._0_8_ = 0xff800000ff800000;
    auVar48._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar48,
                       (undefined1  [16])terminated.field_0);
    iVar16 = 0;
  }
LAB_0041aae7:
  if (iVar16 == 3) {
    auVar2 = vandps_avx(auVar2,(undefined1  [16])terminated.field_0);
    auVar49._8_4_ = 0xff800000;
    auVar49._0_8_ = 0xff800000ff800000;
    auVar49._12_4_ = 0xff800000;
    auVar2 = vmaskmovps_avx(auVar2,auVar49);
    *(undefined1 (*) [16])(ray + 0x80) = auVar2;
    return;
  }
  goto LAB_0041a146;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }